

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

void google::protobuf::util::FieldMaskUtil::Intersect
               (FieldMask *mask1,FieldMask *mask2,FieldMask *out)

{
  Type *full;
  const_iterator cVar1;
  FieldMaskTree *out_00;
  int index;
  ulong uVar2;
  string *prefix;
  long lVar3;
  undefined1 local_c0 [8];
  FieldMaskTree tree;
  FieldMaskTree intersection;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tree;
  tree.root_.children._M_t._M_impl._0_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  intersection.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&intersection;
  intersection.root_.children._M_t._M_impl._0_4_ = 0;
  intersection.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  intersection.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  intersection.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  intersection.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       intersection.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  anon_unknown_0::FieldMaskTree::MergeFromFieldMask((FieldMaskTree *)local_c0,mask1);
  intersection.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&mask2->paths_;
  index = 0;
  do {
    if ((mask2->paths_).super_RepeatedPtrFieldBase.current_size_ <= index) {
      FieldMask::Clear(out);
      anon_unknown_0::FieldMaskTree::MergeToFieldMask
                ((FieldMaskTree *)
                 &tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count,out);
      anon_unknown_0::FieldMaskTree::Node::~Node
                ((Node *)&tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count);
      anon_unknown_0::FieldMaskTree::Node::~Node((Node *)local_c0);
      return;
    }
    full = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     ((RepeatedPtrFieldBase *)
                      intersection.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      index);
    out_00 = (FieldMaskTree *)0x1;
    Split(&local_48,full,".",true);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar2 = 0xffffffffffffffff;
      lVar3 = 0;
      prefix = (string *)local_c0;
      do {
        uVar2 = uVar2 + 1;
        if ((ulong)((long)local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar2) {
          anon_unknown_0::FieldMaskTree::MergeLeafNodesToTree
                    ((FieldMaskTree *)full,prefix,
                     (Node *)&tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     out_00);
          break;
        }
        if (prefix[1]._M_string_length == 0) {
          if (prefix != (string *)local_c0) {
            anon_unknown_0::FieldMaskTree::AddPath
                      ((FieldMaskTree *)
                       &tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count,full);
          }
          break;
        }
        cVar1 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
                        *)prefix,
                       (key_type *)
                       ((long)&((local_48.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar3));
        if (cVar1._M_node == (_Base_ptr)&prefix->_M_string_length) break;
        lVar3 = lVar3 + 0x20;
        prefix = *(string **)(cVar1._M_node + 2);
      } while (prefix != (string *)0x0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    index = index + 1;
  } while( true );
}

Assistant:

void FieldMaskUtil::Intersect(const FieldMask& mask1, const FieldMask& mask2,
                              FieldMask* out) {
  FieldMaskTree tree, intersection;
  tree.MergeFromFieldMask(mask1);
  for (int i = 0; i < mask2.paths_size(); ++i) {
    tree.IntersectPath(mask2.paths(i), &intersection);
  }
  out->Clear();
  intersection.MergeToFieldMask(out);
}